

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O2

string * ANSsmsb<5u>::name_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_49;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"ANSsmsb-",&local_49);
  std::__cxx11::to_string(&local_48,5);
  std::operator+(in_RDI,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

static std::string name()
    {
        return std::string("ANSsmsb-") + std::to_string(H_approx);
    }